

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

int * Extra_PermSchedule(int n)

{
  int *piVar1;
  int *__ptr;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int *piVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  
  if (n < 1) {
    iVar3 = 1;
  }
  else {
    iVar3 = 1;
    iVar2 = 1;
    do {
      iVar3 = iVar3 * iVar2;
      bVar11 = iVar2 != n;
      iVar2 = iVar2 + 1;
    } while (bVar11);
  }
  piVar1 = (int *)malloc((long)iVar3 << 2);
  if (n < 1) {
    __assert_fail("n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                  ,0x8a4,"int *Extra_PermSchedule(int)");
  }
  if (n != 1) {
    if (n != 2) {
      iVar2 = n + -1;
      __ptr = Extra_PermSchedule(iVar2);
      iVar9 = 0;
      iVar8 = (int)((long)iVar3 / (long)n);
      if (1 < iVar8) {
        uVar4 = 0;
        iVar9 = 0;
        do {
          if (n != 1) {
            piVar5 = piVar1 + iVar9;
            iVar9 = iVar9 + iVar2;
            iVar6 = n;
            do {
              *piVar5 = iVar6 + -2;
              piVar5 = piVar5 + 1;
              iVar6 = iVar6 + -1;
            } while (1 < iVar6);
          }
          iVar6 = iVar9 + 1;
          piVar1[iVar9] = __ptr[uVar4 * 2] + 1;
          if (n != 1) {
            lVar7 = 0;
            do {
              iVar10 = iVar9;
              piVar1[iVar6 + lVar7] = (int)lVar7;
              iVar9 = iVar10 + 1;
              lVar7 = lVar7 + 1;
            } while (iVar2 != (int)lVar7);
            iVar6 = iVar10 + 2;
          }
          iVar9 = iVar9 + 2;
          piVar1[iVar6] = __ptr[uVar4 * 2 + 1];
          uVar4 = uVar4 + 1;
        } while (uVar4 != (uint)((int)(((uint)((ulong)((long)iVar3 / (long)n) >> 0x1f) & 1) + iVar8)
                                >> 1));
      }
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      if (iVar9 == iVar3) {
        return piVar1;
      }
      __assert_fail("b == nFact",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/extra/extraUtilMisc.c"
                    ,0x8ba,"int *Extra_PermSchedule(int)");
    }
    piVar1[1] = 0;
  }
  *piVar1 = 0;
  return piVar1;
}

Assistant:

int * Extra_PermSchedule( int n )
{
    int nFact   = Extra_Factorial(n);
    int nGroups = nFact / n / 2;
    int * pRes = ABC_ALLOC( int, nFact );
    int * pRes0, i, k, b = 0;
    assert( n > 0 );
    if ( n == 1 )
    {
        pRes[0] = 0;
        return pRes;
    }
    if ( n == 2 )
    {
        pRes[0] = pRes[1] = 0;
        return pRes;
    }
    pRes0 = Extra_PermSchedule( n-1 );
    for ( k = 0; k < nGroups; k++ )
    {
        for ( i = n-1; i > 0; i-- )
            pRes[b++] = i-1;
        pRes[b++] = pRes0[2*k]+1;
        for ( i = 0; i < n-1; i++ )
            pRes[b++] = i;
        pRes[b++] = pRes0[2*k+1];
    }
    ABC_FREE( pRes0 );
    assert( b == nFact );

    if ( 0 )
    {
        int Perm[16];
        for ( i = 0; i < n; i++ )
            Perm[i] = i;
        for ( b = 0; b < nFact; b++ )
        {
            ABC_SWAP( int, Perm[pRes[b]], Perm[pRes[b]+1] );
            printf( "%3d %3d    ", b, pRes[b] );
            for ( i = 0; i < n; i++ )
                printf( "%d", Perm[i] );
            printf( "\n" );
        }
    }
    return pRes;
}